

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_grow.cpp
# Opt level: O0

int __thiscall
rg::RGProblem::getInnerObstacles
          (RGProblem *this,Vector3i *upper_vertex,Vector3i *lower_vertex,
          vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
          *obstacles)

{
  int iVar1;
  code *pcVar2;
  const_iterator this_00;
  bool bVar3;
  DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *pDVar4;
  CoeffReturnType piVar5;
  reference __x;
  __normal_iterator<const_Eigen::Matrix<int,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>_>
  local_38;
  __normal_iterator<const_Eigen::Matrix<int,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>_>
  local_30;
  const_iterator it;
  vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
  *obstacles_local;
  Vector3i *lower_vertex_local;
  Vector3i *upper_vertex_local;
  RGProblem *this_local;
  
  it._M_current = (Matrix<int,_3,_1,_0,_3,_1> *)obstacles;
  std::
  vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>::
  clear(obstacles);
  local_30._M_current =
       (Matrix<int,_3,_1,_0,_3,_1> *)
       std::
       vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
       ::cbegin((vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                 *)this);
  while( true ) {
    local_38._M_current =
         (Matrix<int,_3,_1,_0,_3,_1> *)
         std::
         vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
         ::cend((vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                 *)this);
    bVar3 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar3) break;
    pDVar4 = (DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)
             __gnu_cxx::
             __normal_iterator<const_Eigen::Matrix<int,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>_>
             ::operator->(&local_30);
    piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::x(pDVar4);
    iVar1 = *piVar5;
    piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::x
                       ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)upper_vertex);
    if (iVar1 <= *piVar5 + 1) {
      pDVar4 = (DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)
               __gnu_cxx::
               __normal_iterator<const_Eigen::Matrix<int,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>_>
               ::operator->(&local_30);
      piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::x(pDVar4);
      iVar1 = *piVar5;
      piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::x
                         ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)lower_vertex);
      if (*piVar5 + -1 <= iVar1) {
        pDVar4 = (DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)
                 __gnu_cxx::
                 __normal_iterator<const_Eigen::Matrix<int,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>_>
                 ::operator->(&local_30);
        piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::y(pDVar4);
        iVar1 = *piVar5;
        piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::y
                           ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)upper_vertex);
        if (iVar1 <= *piVar5 + 1) {
          pDVar4 = (DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)
                   __gnu_cxx::
                   __normal_iterator<const_Eigen::Matrix<int,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>_>
                   ::operator->(&local_30);
          piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::y(pDVar4);
          iVar1 = *piVar5;
          piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::y
                             ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)lower_vertex)
          ;
          if (*piVar5 + -1 <= iVar1) {
            pDVar4 = (DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)
                     __gnu_cxx::
                     __normal_iterator<const_Eigen::Matrix<int,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>_>
                     ::operator->(&local_30);
            piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::z(pDVar4);
            iVar1 = *piVar5;
            piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::z
                               ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)
                                upper_vertex);
            if (iVar1 <= *piVar5 + 1) {
              pDVar4 = (DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)
                       __gnu_cxx::
                       __normal_iterator<const_Eigen::Matrix<int,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>_>
                       ::operator->(&local_30);
              piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::z(pDVar4);
              iVar1 = *piVar5;
              piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::z
                                 ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)
                                  lower_vertex);
              this_00 = it;
              if (*piVar5 + -1 <= iVar1) {
                __x = __gnu_cxx::
                      __normal_iterator<const_Eigen::Matrix<int,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>_>
                      ::operator*(&local_30);
                std::
                vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                ::push_back((vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                             *)this_00._M_current,__x);
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Eigen::Matrix<int,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>_>
    ::operator++(&local_30);
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

int RGProblem::getInnerObstacles(const Eigen::Vector3i &upper_vertex, const Eigen::Vector3i &lower_vertex, std::vector<Eigen::Vector3i> *obstacles) const
{
  obstacles->clear();

  for (auto it = this->obstacle_pts.cbegin(); it != this->obstacle_pts.cend(); ++it)
  {
    if ( (it->x() <= upper_vertex.x() + 1) && (it->x() >= lower_vertex.x() - 1)
    && (it->y() <= upper_vertex.y() + 1) && (it->y() >= lower_vertex.y() - 1)
    && (it->z() <= upper_vertex.z() + 1) && (it->z() >= lower_vertex.z() - 1) )
      obstacles->push_back(*it);
  }
}